

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O0

void __thiscall
SQCompilation::CodegenVisitor::visitWhileStatement(CodegenVisitor *this,WhileStatement *whileLoop)

{
  undefined8 uVar1;
  long lVar2;
  size_type sVar3;
  long *plVar4;
  WhileStatement *in_RSI;
  SQFuncState *in_RDI;
  SQInteger oldouters_1;
  SQInteger oldouters;
  SQScope __oldscope___1;
  SQInteger jzpos;
  SQInteger __ncontinues__;
  SQInteger __nbreaks__;
  SQInteger jmppos;
  SQScope __oldscope__;
  long *in_stack_ffffffffffffff08;
  SQInteger targetpos;
  sqvector<long,_unsigned_int> *in_stack_ffffffffffffff10;
  SQInteger ntoresolve;
  CodegenVisitor *in_stack_ffffffffffffff18;
  SQFuncState *funcstate;
  SQFuncState *in_stack_ffffffffffffff20;
  CodegenVisitor *this_00;
  SQFuncState *funcstate_00;
  SQInteger in_stack_ffffffffffffff30;
  CodegenVisitor *this_01;
  undefined8 in_stack_ffffffffffffff38;
  SQOpcode SVar5;
  undefined1 *pos;
  SQAllocContext *n;
  SQFuncState *this_02;
  undefined1 local_98 [16];
  undefined8 local_88;
  long *plStack_80;
  CodegenVisitor *local_78;
  undefined8 local_70;
  undefined8 local_68;
  ulong local_60;
  ulong local_58;
  SQInteger local_50;
  SQLocalVarInfo *local_28;
  SQAllocContext pSStack_20;
  WhileStatement *local_10;
  
  SVar5 = (SQOpcode)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  local_10 = in_RSI;
  addLineNumber((CodegenVisitor *)in_stack_ffffffffffffff20,(Statement *)in_stack_ffffffffffffff18);
  local_28 = *(SQLocalVarInfo **)&(in_RDI->_vlocals)._size;
  pSStack_20 = (SQAllocContext)(in_RDI->_targetstack)._vals;
  uVar1 = *(undefined8 *)(in_RDI->_returnexp + 0x1d0);
  (in_RDI->_vlocals)._size = (int)uVar1;
  (in_RDI->_vlocals)._allocated = (int)((ulong)uVar1 >> 0x20);
  plVar4 = (long *)SQFuncState::GetStackSize((SQFuncState *)0x1c26ea);
  (in_RDI->_targetstack)._vals = plVar4;
  n = &(in_RDI->_targetstack)._alloc_ctx;
  this_02 = (SQFuncState *)&stack0xffffffffffffffc8;
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff10);
  sqvector<SQObjectPtr,_unsigned_int>::push_back
            ((sqvector<SQObjectPtr,_unsigned_int> *)in_stack_ffffffffffffff20,
             (SQObjectPtr *)in_stack_ffffffffffffff18);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff10);
  local_50 = SQFuncState::GetCurrentPos((SQFuncState *)0x1c273d);
  WhileStatement::condition(local_10);
  visitForceGet((CodegenVisitor *)in_stack_ffffffffffffff20,(Node *)in_stack_ffffffffffffff18);
  sVar3 = sqvector<long,_unsigned_int>::size
                    ((sqvector<long,_unsigned_int> *)(in_RDI->_returnexp + 0x50));
  local_58 = (ulong)sVar3;
  sVar3 = sqvector<long,_unsigned_int>::size
                    ((sqvector<long,_unsigned_int> *)(in_RDI->_returnexp + 0x68));
  local_60 = (ulong)sVar3;
  local_68 = 0;
  sqvector<long,_unsigned_int>::push_back(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  local_70 = 0;
  sqvector<long,_unsigned_int>::push_back(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  sqvector<long,_unsigned_int>::push_back(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  funcstate_00 = (SQFuncState *)in_RDI->_returnexp;
  SQFuncState::PopTarget(in_stack_ffffffffffffff20);
  SQFuncState::AddInstruction
            (in_RDI,SVar5,in_stack_ffffffffffffff30,(SQInteger)funcstate_00,
             (SQInteger)in_stack_ffffffffffffff20,(SQInteger)in_stack_ffffffffffffff18);
  local_78 = (CodegenVisitor *)SQFuncState::GetCurrentPos((SQFuncState *)0x1c2844);
  local_88._0_4_ = (in_RDI->_vlocals)._size;
  local_88._4_4_ = (in_RDI->_vlocals)._allocated;
  plStack_80 = (in_RDI->_targetstack)._vals;
  uVar1 = *(undefined8 *)(in_RDI->_returnexp + 0x1d0);
  (in_RDI->_vlocals)._size = (int)uVar1;
  (in_RDI->_vlocals)._allocated = (int)((ulong)uVar1 >> 0x20);
  plVar4 = (long *)SQFuncState::GetStackSize((SQFuncState *)0x1c2875);
  (in_RDI->_targetstack)._vals = plVar4;
  this_01 = (CodegenVisitor *)&(in_RDI->_targetstack)._alloc_ctx;
  pos = local_98;
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff10);
  sqvector<SQObjectPtr,_unsigned_int>::push_back
            ((sqvector<SQObjectPtr,_unsigned_int> *)in_stack_ffffffffffffff20,
             (SQObjectPtr *)in_stack_ffffffffffffff18);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff10);
  LoopStatement::body(&local_10->super_LoopStatement);
  Node::visit<SQCompilation::CodegenVisitor>
            ((Node *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  lVar2 = *(long *)(in_RDI->_returnexp + 0x1d0);
  plVar4 = (long *)SQFuncState::GetStackSize((SQFuncState *)0x1c28ec);
  if ((plVar4 != (in_RDI->_targetstack)._vals) &&
     (SQFuncState::SetStackSize(this_02,(SQInteger)n),
     lVar2 != *(long *)(in_RDI->_returnexp + 0x1d0))) {
    SQFuncState::AddInstruction
              (in_RDI,(SQOpcode)((ulong)pos >> 0x20),(SQInteger)this_01,(SQInteger)funcstate_00,
               (SQInteger)in_stack_ffffffffffffff20,(SQInteger)in_stack_ffffffffffffff18);
  }
  (in_RDI->_vlocals)._size = (undefined4)local_88;
  (in_RDI->_vlocals)._allocated = local_88._4_4_;
  (in_RDI->_targetstack)._vals = plStack_80;
  sqvector<SQObjectPtr,_unsigned_int>::pop_back((sqvector<SQObjectPtr,_unsigned_int> *)0x1c29b3);
  ntoresolve = in_RDI->_returnexp;
  targetpos = local_50;
  SQFuncState::GetCurrentPos((SQFuncState *)0x1c29d6);
  SQFuncState::AddInstruction
            (in_RDI,(SQOpcode)((ulong)pos >> 0x20),(SQInteger)this_01,(SQInteger)funcstate_00,
             (SQInteger)in_stack_ffffffffffffff20,(SQInteger)in_stack_ffffffffffffff18);
  funcstate = (SQFuncState *)in_RDI->_returnexp;
  this_00 = local_78;
  SQFuncState::GetCurrentPos((SQFuncState *)0x1c2a1f);
  SQFuncState::SetInstructionParam(in_RDI,(SQInteger)pos,(SQInteger)this_01,(SQInteger)funcstate_00)
  ;
  SVar5 = (SQOpcode)((ulong)pos >> 0x20);
  sVar3 = sqvector<long,_unsigned_int>::size
                    ((sqvector<long,_unsigned_int> *)(in_RDI->_returnexp + 0x50));
  local_58 = sVar3 - local_58;
  sVar3 = sqvector<long,_unsigned_int>::size
                    ((sqvector<long,_unsigned_int> *)(in_RDI->_returnexp + 0x68));
  local_60 = sVar3 - local_60;
  if (0 < (long)local_60) {
    ResolveContinues(this_00,funcstate,ntoresolve,targetpos);
  }
  if (0 < (long)local_58) {
    ResolveBreaks(this_01,funcstate_00,(SQInteger)this_00);
  }
  sqvector<long,_unsigned_int>::pop_back
            ((sqvector<long,_unsigned_int> *)(in_RDI->_returnexp + 0x160));
  sqvector<long,_unsigned_int>::pop_back
            ((sqvector<long,_unsigned_int> *)(in_RDI->_returnexp + 0x178));
  sqvector<long,_unsigned_int>::pop_back((sqvector<long,_unsigned_int> *)(in_RDI->_returnexp + 400))
  ;
  lVar2 = *(long *)(in_RDI->_returnexp + 0x1d0);
  plVar4 = (long *)SQFuncState::GetStackSize((SQFuncState *)0x1c2b2f);
  if ((plVar4 != (in_RDI->_targetstack)._vals) &&
     (SQFuncState::SetStackSize(this_02,(SQInteger)n),
     lVar2 != *(long *)(in_RDI->_returnexp + 0x1d0))) {
    SQFuncState::AddInstruction
              (in_RDI,SVar5,(SQInteger)this_01,(SQInteger)funcstate_00,(SQInteger)this_00,
               (SQInteger)funcstate);
  }
  *(SQLocalVarInfo **)&(in_RDI->_vlocals)._size = local_28;
  (in_RDI->_targetstack)._vals = (long *)pSStack_20;
  sqvector<SQObjectPtr,_unsigned_int>::pop_back((sqvector<SQObjectPtr,_unsigned_int> *)0x1c2bad);
  return;
}

Assistant:

void CodegenVisitor::visitWhileStatement(WhileStatement *whileLoop) {
    addLineNumber(whileLoop);

    BEGIN_SCOPE();
    {
        SQInteger jmppos = _fs->GetCurrentPos();

        visitForceGet(whileLoop->condition());

        BEGIN_BREAKABLE_BLOCK();

        _fs->AddInstruction(_OP_JZ, _fs->PopTarget());

        SQInteger jzpos = _fs->GetCurrentPos();

        BEGIN_SCOPE();

        whileLoop->body()->visit(this);

        END_SCOPE();

        _fs->AddInstruction(_OP_JMP, 0, jmppos - _fs->GetCurrentPos() - 1);
        _fs->SetInstructionParam(jzpos, 1, _fs->GetCurrentPos() - jzpos);

        END_BREAKABLE_BLOCK(jmppos);
    }
    END_SCOPE();
}